

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gencode.c
# Opt level: O0

block * gen_mcode6(compiler_state_t *cstate,char *s1,char *s2,uint masklen,qual q)

{
  addrinfo *__ai;
  block *pbVar1;
  u_int32_t *m;
  u_int32_t *a;
  block *b;
  in6_addr mask;
  in6_addr *addr;
  addrinfo *res;
  uint masklen_local;
  char *s2_local;
  char *s1_local;
  compiler_state_t *cstate_local;
  qual q_local;
  
  if (s2 != (char *)0x0) {
    bpf_error(cstate,"no mask %s supported",s2);
  }
  __ai = pcap_nametoaddrinfo(s1);
  if (__ai == (addrinfo *)0x0) {
    bpf_error(cstate,"invalid ip6 address %s",s1);
  }
  cstate->ai = __ai;
  if (__ai->ai_next != (addrinfo *)0x0) {
    bpf_error(cstate,"%s resolved to multiple address",s1);
  }
  mask.__in6_u._8_8_ = __ai->ai_addr->sa_data + 6;
  if (0x80 < masklen) {
    bpf_error(cstate,"mask length must be <= %u",0x80);
  }
  memset(&b,0,0x10);
  memset(&b,0xff,(ulong)(masklen >> 3));
  if ((masklen & 7) != 0) {
    *(char *)((long)&b + (ulong)(masklen >> 3)) = (char)(0xff << (8 - ((byte)masklen & 7) & 0x1f));
  }
  if (((((*(uint *)mask.__in6_u._8_8_ & ((uint)b ^ 0xffffffff)) != 0) ||
       ((*(uint *)(mask.__in6_u._8_8_ + 4) & (b._4_4_ ^ 0xffffffff)) != 0)) ||
      ((*(uint *)(mask.__in6_u._8_8_ + 8) & (mask.__in6_u.__u6_addr32[0] ^ 0xffffffff)) != 0)) ||
     ((*(uint *)(mask.__in6_u._8_8_ + 0xc) & (mask.__in6_u.__u6_addr32[1] ^ 0xffffffff)) != 0)) {
    bpf_error(cstate,"non-network bits set in \"%s/%d\"",s1,(ulong)masklen);
  }
  if (((uint)q & 0xff) < 2) {
    if (masklen != 0x80) {
      bpf_error(cstate,"Mask syntax for networks only");
    }
  }
  else if (((uint)q & 0xff) != 2) {
    bpf_error(cstate,"invalid qualifier against IPv6 address");
    return (block *)0x0;
  }
  pbVar1 = gen_host6(cstate,(in6_addr *)mask.__in6_u._8_8_,(in6_addr *)&b,(uint)q >> 8 & 0xff,
                     (uint)q >> 0x10 & 0xff,(uint)q & 0xff);
  cstate->ai = (addrinfo *)0x0;
  freeaddrinfo((addrinfo *)__ai);
  return pbVar1;
}

Assistant:

struct block *
gen_mcode6(compiler_state_t *cstate, const char *s1, const char *s2,
    unsigned int masklen, struct qual q)
{
	struct addrinfo *res;
	struct in6_addr *addr;
	struct in6_addr mask;
	struct block *b;
	u_int32_t *a, *m;

	if (s2)
		bpf_error(cstate, "no mask %s supported", s2);

	res = pcap_nametoaddrinfo(s1);
	if (!res)
		bpf_error(cstate, "invalid ip6 address %s", s1);
	cstate->ai = res;
	if (res->ai_next)
		bpf_error(cstate, "%s resolved to multiple address", s1);
	addr = &((struct sockaddr_in6 *)res->ai_addr)->sin6_addr;

	if (sizeof(mask) * 8 < masklen)
		bpf_error(cstate, "mask length must be <= %u", (unsigned int)(sizeof(mask) * 8));
	memset(&mask, 0, sizeof(mask));
	memset(&mask, 0xff, masklen / 8);
	if (masklen % 8) {
		mask.s6_addr[masklen / 8] =
			(0xff << (8 - masklen % 8)) & 0xff;
	}

	a = (u_int32_t *)addr;
	m = (u_int32_t *)&mask;
	if ((a[0] & ~m[0]) || (a[1] & ~m[1])
	 || (a[2] & ~m[2]) || (a[3] & ~m[3])) {
		bpf_error(cstate, "non-network bits set in \"%s/%d\"", s1, masklen);
	}

	switch (q.addr) {

	case Q_DEFAULT:
	case Q_HOST:
		if (masklen != 128)
			bpf_error(cstate, "Mask syntax for networks only");
		/* FALLTHROUGH */

	case Q_NET:
		b = gen_host6(cstate, addr, &mask, q.proto, q.dir, q.addr);
		cstate->ai = NULL;
		freeaddrinfo(res);
		return b;

	default:
		bpf_error(cstate, "invalid qualifier against IPv6 address");
		/* NOTREACHED */
	}
	return NULL;
}